

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = v;
  if (0x7f < v) {
    do {
      *dst = (byte)v | 0x80;
      dst = (char *)((byte *)dst + 1);
      uVar3 = v >> 7;
      bVar2 = 0x3fff < v;
      v = uVar3;
    } while (bVar2);
  }
  *dst = (byte)uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (char *)((byte *)dst + 1);
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<uint8_t>(v);
  return reinterpret_cast<char*>(ptr);
}